

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

_Bool tableSet(Table *table,ObjString *key,Value value)

{
  Entry *pEVar1;
  Value in_RDX;
  ObjString *in_RSI;
  int *in_RDI;
  bool bVar2;
  _Bool isNewKey;
  Entry *entry;
  int capacity;
  
  if ((double)(in_RDI[1] + 1) * 0.75 < (double)(*in_RDI + 1)) {
    adjustCapacity((Table *)in_RSI,(int)(in_RDX >> 0x20));
  }
  pEVar1 = findEntry(*(Entry **)(in_RDI + 2),in_RDI[1],in_RSI);
  bVar2 = pEVar1->key == (ObjString *)0x0;
  if ((bVar2) && (pEVar1->value == 0x7ffc000000000001)) {
    *in_RDI = *in_RDI + 1;
  }
  pEVar1->key = in_RSI;
  pEVar1->value = in_RDX;
  return bVar2;
}

Assistant:

bool tableSet(Table *table, ObjString *key, Value value) {
    //grow when the array becomes at least 75% full.
    if (table->count + 1 > (table->capacity + 1) * TABLE_MAX_LOAD) {
        int capacity = GROW_CAPACITY(table->capacity + 1) - 1;
        adjustCapacity(table, capacity);
    }

    Entry *entry = findEntry(table->entries, table->capacity, key);
    bool isNewKey = entry->key == NULL;

    //The count is no longer the number of entries in the hash table,
    // it’s the number of entries plus tombstones
    if (isNewKey && IS_NIL(entry->value)) table->count++;

    entry->key = key;
    entry->value = value;
    return isNewKey;
}